

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O1

bool __thiscall
draco::AttributeQuantizationTransform::ComputeParameters
          (AttributeQuantizationTransform *this,PointAttribute *attribute,int quantization_bits)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  long lVar4;
  DataBuffer *pDVar5;
  size_t __n;
  pointer pfVar6;
  void *__dest;
  void *__dest_00;
  ulong uVar7;
  ulong uVar8;
  ulong __n_00;
  bool bVar9;
  float fVar10;
  float fVar11;
  allocator_type local_79;
  vector<float,_std::allocator<float>_> *local_78;
  size_t local_70;
  AttributeQuantizationTransform *local_68;
  ulong local_60;
  DataBuffer *local_58;
  value_type_conflict2 local_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  bVar9 = false;
  if ((quantization_bits - 1U < 0x1e) && (bVar9 = false, this->quantization_bits_ == -1)) {
    this->quantization_bits_ = quantization_bits;
    bVar3 = (attribute->super_GeometryAttribute).num_components_;
    __n_00 = (ulong)bVar3;
    this->range_ = 0.0;
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::vector(&local_48,__n_00,&local_4c,&local_79);
    local_78 = &this->min_values_;
    std::vector<float,_std::allocator<float>_>::_M_move_assign(local_78,&local_48);
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar8 = (ulong)((uint)bVar3 * 4);
    local_68 = this;
    __dest = operator_new__(uVar8);
    __dest_00 = operator_new__(uVar8);
    lVar4 = (attribute->super_GeometryAttribute).byte_offset_;
    pDVar5 = (attribute->super_GeometryAttribute).buffer_;
    local_70 = (attribute->super_GeometryAttribute).byte_stride_;
    memcpy(__dest_00,
           (void *)((long)(pDVar5->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar4),local_70);
    memcpy((local_78->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start,
           (void *)(lVar4 + (long)(pDVar5->data_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start),local_70);
    local_70 = (attribute->super_GeometryAttribute).byte_offset_;
    local_58 = (attribute->super_GeometryAttribute).buffer_;
    __n = (attribute->super_GeometryAttribute).byte_stride_;
    memcpy(__dest,(void *)((long)(local_58->data_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + local_70),__n);
    local_60 = (ulong)attribute->num_unique_entries_;
    if (1 < local_60) {
      pfVar6 = (local_78->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 1;
      do {
        memcpy(__dest_00,
               (void *)((long)(local_58->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + local_70 + __n * uVar8),__n
              );
        if (__n_00 != 0) {
          uVar7 = 0;
          do {
            fVar2 = *(float *)((long)__dest_00 + uVar7 * 4);
            if (fVar2 < pfVar6[uVar7]) {
              pfVar6[uVar7] = fVar2;
            }
            fVar2 = *(float *)((long)__dest_00 + uVar7 * 4);
            pfVar1 = (float *)((long)__dest + uVar7 * 4);
            if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
              *(float *)((long)__dest + uVar7 * 4) = fVar2;
            }
            uVar7 = uVar7 + 1;
          } while (__n_00 != uVar7);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_60);
    }
    bVar9 = __n_00 == 0;
    if (bVar9) {
LAB_001a5bad:
      if ((local_68->range_ == 0.0) && (!NAN(local_68->range_))) {
        local_68->range_ = 1.0;
      }
    }
    else {
      pfVar1 = (local_78->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar2 = *pfVar1;
      if ((uint)ABS(fVar2) < 0x7f800000) {
        fVar10 = local_68->range_;
        uVar8 = 1;
        do {
          fVar11 = *(float *)((long)__dest + uVar8 * 4 + -4);
          if (0x7f7fffff < (uint)ABS(fVar11)) break;
          fVar11 = fVar11 - fVar2;
          if (fVar10 < fVar11) {
            local_68->range_ = fVar11;
            fVar10 = fVar11;
          }
          bVar9 = __n_00 <= uVar8;
          if (__n_00 == uVar8) goto LAB_001a5bad;
          fVar2 = pfVar1[uVar8];
          uVar8 = uVar8 + 1;
        } while ((uint)ABS(fVar2) < 0x7f800000);
      }
    }
    operator_delete__(__dest_00);
    operator_delete__(__dest);
  }
  return bVar9;
}

Assistant:

bool AttributeQuantizationTransform::ComputeParameters(
    const PointAttribute &attribute, const int quantization_bits) {
  if (quantization_bits_ != -1) {
    return false;  // already initialized.
  }
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;

  const int num_components = attribute.num_components();
  range_ = 0.f;
  min_values_ = std::vector<float>(num_components, 0.f);
  const std::unique_ptr<float[]> max_values(new float[num_components]);
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  // Compute minimum values and max value difference.
  attribute.GetValue(AttributeValueIndex(0), att_val.get());
  attribute.GetValue(AttributeValueIndex(0), min_values_.data());
  attribute.GetValue(AttributeValueIndex(0), max_values.get());

  for (AttributeValueIndex i(1); i < static_cast<uint32_t>(attribute.size());
       ++i) {
    attribute.GetValue(i, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      if (min_values_[c] > att_val[c]) {
        min_values_[c] = att_val[c];
      }
      if (max_values[c] < att_val[c]) {
        max_values[c] = att_val[c];
      }
    }
  }
  for (int c = 0; c < num_components; ++c) {
    if (std::isnan(min_values_[c]) || std::isinf(min_values_[c]) ||
        std::isnan(max_values[c]) || std::isinf(max_values[c])) {
      return false;
    }
    const float dif = max_values[c] - min_values_[c];
    if (dif > range_) {
      range_ = dif;
    }
  }

  // In case all values are the same, initialize the range to unit length. This
  // will ensure that all values are quantized properly to the same value.
  if (range_ == 0.f) {
    range_ = 1.f;
  }

  return true;
}